

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O1

void Acb_ObjDeriveTfo(Acb_Ntk_t *p,int Pivot,int nTfoLevMax,int nFanMax,Vec_Int_t **pvTfo,
                     Vec_Int_t **pvRoots,int fDelay)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  Vec_Int_t *vTfo;
  int *piVar5;
  Vec_Int_t *vRoots;
  int iVar6;
  long lVar7;
  
  iVar4 = Acb_ObjLabelTfo(p,Pivot,nTfoLevMax,nFanMax,fDelay);
  vTfo = (Vec_Int_t *)malloc(0x10);
  vTfo->nCap = 0x10;
  vTfo->nSize = 0;
  piVar5 = (int *)malloc(0x40);
  vTfo->pArray = piVar5;
  *pvTfo = vTfo;
  vRoots = (Vec_Int_t *)malloc(0x10);
  vRoots->nCap = 0x10;
  vRoots->nSize = 0;
  piVar5 = (int *)malloc(0x40);
  vRoots->pArray = piVar5;
  *pvRoots = vRoots;
  if (iVar4 != 0) {
    return;
  }
  if ((p->vObjTrav).nSize < 1) {
    uVar1 = (p->vObjType).nCap;
    if ((p->vObjTrav).nCap < (int)uVar1) {
      piVar5 = (p->vObjTrav).pArray;
      if (piVar5 == (int *)0x0) {
        piVar5 = (int *)malloc((long)(int)uVar1 << 2);
      }
      else {
        piVar5 = (int *)realloc(piVar5,(long)(int)uVar1 << 2);
      }
      (p->vObjTrav).pArray = piVar5;
      if (piVar5 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (p->vObjTrav).nCap = uVar1;
    }
    if (0 < (int)uVar1) {
      memset((p->vObjTrav).pArray,0,(ulong)uVar1 * 4);
    }
    (p->vObjTrav).nSize = uVar1;
  }
  p->nObjTravs = p->nObjTravs + 1;
  Acb_ObjDeriveTfo_rec(p,Pivot,vTfo,vRoots,fDelay);
  iVar4 = vTfo->nSize;
  if (0 < (long)iVar4) {
    piVar5 = vTfo->pArray;
    if (piVar5[(long)iVar4 + -1] != Pivot) {
      __assert_fail("Vec_IntEntryLast(vTfo) == Pivot",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                    ,0x281,
                    "void Acb_ObjDeriveTfo(Acb_Ntk_t *, int, int, int, Vec_Int_t **, Vec_Int_t **, int)"
                   );
    }
    iVar6 = iVar4 + -1;
    vTfo->nSize = iVar6;
    if (0 < (long)vRoots->nSize) {
      piVar3 = vRoots->pArray;
      if (piVar3[(long)vRoots->nSize + -1] == Pivot) {
        __assert_fail("Vec_IntEntryLast(vRoots) != Pivot",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                      ,0x283,
                      "void Acb_ObjDeriveTfo(Acb_Ntk_t *, int, int, int, Vec_Int_t **, Vec_Int_t **, int)"
                     );
      }
      if (2 < iVar4) {
        iVar4 = -1;
        lVar7 = 0;
        do {
          iVar2 = piVar5[lVar7];
          piVar5[lVar7] = piVar5[iVar6 + iVar4];
          piVar5[vTfo->nSize + iVar4] = iVar2;
          lVar7 = lVar7 + 1;
          iVar6 = vTfo->nSize;
          iVar4 = iVar4 + -1;
        } while (lVar7 < iVar6 / 2);
      }
      iVar4 = vRoots->nSize;
      if (iVar4 < 2) {
        return;
      }
      iVar6 = -1;
      lVar7 = 0;
      do {
        iVar2 = piVar3[lVar7];
        piVar3[lVar7] = piVar3[iVar4 + iVar6];
        piVar3[vRoots->nSize + iVar6] = iVar2;
        lVar7 = lVar7 + 1;
        iVar4 = vRoots->nSize;
        iVar6 = iVar6 + -1;
      } while (lVar7 < iVar4 / 2);
      return;
    }
  }
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x201,"int Vec_IntEntryLast(Vec_Int_t *)");
}

Assistant:

void Acb_ObjDeriveTfo( Acb_Ntk_t * p, int Pivot, int nTfoLevMax, int nFanMax, Vec_Int_t ** pvTfo, Vec_Int_t ** pvRoots, int fDelay )
{
    int Res = Acb_ObjLabelTfo( p, Pivot, nTfoLevMax, nFanMax, fDelay );
    Vec_Int_t * vTfo   = *pvTfo   = Vec_IntAlloc( 10 );
    Vec_Int_t * vRoots = *pvRoots = Vec_IntAlloc( 10 );
    if ( Res ) // none or root
        return;
    Acb_NtkIncTravId( p ); // root (2)   inner (1)  visited (0)
    Acb_ObjDeriveTfo_rec( p, Pivot, vTfo, vRoots, fDelay );
    assert( Vec_IntEntryLast(vTfo) == Pivot );
    Vec_IntPop( vTfo );
    assert( Vec_IntEntryLast(vRoots) != Pivot );
    Vec_IntReverseOrder( vTfo );
    Vec_IntReverseOrder( vRoots );
}